

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start_Resume_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Start_Resume_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Start_Resume_PDU *this)

{
  ostream *poVar1;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KStringStream ss;
  KString local_260;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_200,(Header7 *)this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-Start/Resume PDU-\n",0x13);
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_220,&this->super_Simulation_Management_Header);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Real World Time:\n",0x11);
  DATA_TYPE::ClockTime::GetAsString_abi_cxx11_(&local_1c0,&this->m_RealWorldTime);
  UTILS::IndentString(&local_240,&local_1c0,Tabs,in_CL);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_240._M_dataplus._M_p,local_240._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Simulation Time:\n",0x11);
  DATA_TYPE::ClockTime::GetAsString_abi_cxx11_(&local_1e0,&this->m_SimTime);
  UTILS::IndentString(&local_260,&local_1e0,Tabs_00,in_CL);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_260._M_dataplus._M_p,local_260._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Request ID: ",0xc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString Start_Resume_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Start/Resume PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "Real World Time:\n"
       << IndentString( m_RealWorldTime.GetAsString(), 1 )
       << "Simulation Time:\n"
       << IndentString( m_SimTime.GetAsString(), 1 )
       << "Request ID: " << m_ui32RequestID
       << "\n";

    return ss.str();
}